

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O2

IOStream * __thiscall
Assimp::ZipArchiveIOSystem::Open(ZipArchiveIOSystem *this,char *pFilename,char *pMode)

{
  IOStream *pIVar1;
  string filename;
  allocator local_31;
  string local_30;
  
  if (pFilename == (char *)0x0) {
    __assert_fail("pFilename != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                  ,0x1f5,
                  "virtual IOStream *Assimp::ZipArchiveIOSystem::Open(const char *, const char *)");
  }
  while( true ) {
    if (*pMode == '\0') {
      std::__cxx11::string::string((string *)&local_30,pFilename,&local_31);
      pIVar1 = Implement::OpenFile(this->pImpl,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return pIVar1;
    }
    if (*pMode == 'w') break;
    pMode = pMode + 1;
  }
  __assert_fail("pMode[i] != \'w\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                ,0x1f9,
                "virtual IOStream *Assimp::ZipArchiveIOSystem::Open(const char *, const char *)");
}

Assistant:

IOStream * ZipArchiveIOSystem::Open(const char* pFilename, const char* pMode) {
        ai_assert(pFilename != nullptr);

        for (size_t i = 0; pMode[i] != 0; ++i)
        {
            ai_assert(pMode[i] != 'w');
            if (pMode[i] == 'w')
                return nullptr;
        }

        std::string filename(pFilename);
        return pImpl->OpenFile(filename);
    }